

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O2

dictEntry * dictFind(dict *ht,void *key)

{
  dictEntry *pdVar1;
  _func_int_void_ptr_void_ptr_void_ptr *p_Var2;
  uint uVar3;
  int iVar4;
  dictEntry **ppdVar5;
  
  if (ht->size != 0) {
    uVar3 = (*ht->type->hashFunction)(key);
    ppdVar5 = ht->table + (uVar3 & (uint)ht->sizemask);
    while (pdVar1 = *ppdVar5, pdVar1 != (dictEntry *)0x0) {
      p_Var2 = ht->type->keyCompare;
      if (p_Var2 == (_func_int_void_ptr_void_ptr_void_ptr *)0x0) {
        if (pdVar1->key == key) {
          return pdVar1;
        }
      }
      else {
        iVar4 = (*p_Var2)(ht->privdata,key,pdVar1->key);
        if (iVar4 != 0) {
          return pdVar1;
        }
      }
      ppdVar5 = &pdVar1->next;
    }
  }
  return (dictEntry *)0x0;
}

Assistant:

static dictEntry *dictFind(dict *ht, const void *key) {
    dictEntry *he;
    unsigned int h;

    if (ht->size == 0) return NULL;
    h = dictHashKey(ht, key) & ht->sizemask;
    he = ht->table[h];
    while(he) {
        if (dictCompareHashKeys(ht, key, he->key))
            return he;
        he = he->next;
    }
    return NULL;
}